

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall QGraphicsViewPrivate::processPendingUpdates(QGraphicsViewPrivate *this)

{
  QWidget *this_00;
  QRegionData *pQVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QRegion local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)&this->scene);
  if (bVar2) {
    if ((this->field_0x301 & 0x10) == 0) {
      this_00 = (this->super_QAbstractScrollAreaPrivate).viewport;
      if (this->viewportUpdateMode == BoundingRectViewportUpdate) {
        QWidget::update(this_00,&this->dirtyBoundingRect);
      }
      else {
        QWidget::update(this_00,&this->dirtyRegion);
      }
    }
    else {
      QWidget::update((this->super_QAbstractScrollAreaPrivate).viewport);
    }
    (this->dirtyBoundingRect).x1 = 0;
    (this->dirtyBoundingRect).y1 = 0;
    (this->dirtyBoundingRect).x2 = -1;
    (this->dirtyBoundingRect).y2 = -1;
    QRegion::QRegion(&local_20);
    pQVar1 = (this->dirtyRegion).d;
    (this->dirtyRegion).d = local_20.d;
    local_20.d = pQVar1;
    QRegion::~QRegion(&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsViewPrivate::processPendingUpdates()
{
    if (!scene)
        return;

    if (fullUpdatePending) {
        viewport->update();
    } else if (viewportUpdateMode == QGraphicsView::BoundingRectViewportUpdate) {
        viewport->update(dirtyBoundingRect);
    } else {
        viewport->update(dirtyRegion); // Already adjusted in updateRect/Region.
    }

    dirtyBoundingRect = QRect();
    dirtyRegion = QRegion();
}